

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printStruct(PrinterStream *this,Structure *s)

{
  CodePrinter *pCVar1;
  Member *pMVar2;
  int iVar3;
  long lVar4;
  Member *m;
  Indent indent;
  string local_68;
  string local_48;
  
  pCVar1 = choc::text::CodePrinter::operator<<(this->out,"struct ");
  pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,&s->name);
  choc::text::CodePrinter::startNewLine(pCVar1);
  pMVar2 = (s->members).items;
  iVar3 = 0;
  for (lVar4 = (s->members).numActive << 6; lVar4 != 0; lVar4 = lVar4 + -0x40) {
    getTypeDescription_abi_cxx11_(&local_68,this,&pMVar2->type);
    if (iVar3 <= (int)local_68._M_string_length) {
      iVar3 = (int)local_68._M_string_length;
    }
    std::__cxx11::string::~string((string *)&local_68);
    pMVar2 = pMVar2 + 1;
  }
  choc::text::CodePrinter::createIndentWithBraces((CodePrinter *)&indent,(size_t)this->out);
  pMVar2 = (s->members).items;
  for (lVar4 = (s->members).numActive << 6; lVar4 != 0; lVar4 = lVar4 + -0x40) {
    pCVar1 = this->out;
    getTypeDescription_abi_cxx11_(&local_48,this,&pMVar2->type);
    padded(&local_68,&local_48,iVar3 + 2);
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,&local_68);
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,&pMVar2->name);
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,';');
    choc::text::CodePrinter::startNewLine(pCVar1);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    pMVar2 = pMVar2 + 1;
  }
  choc::text::CodePrinter::Indent::~Indent(&indent);
  choc::text::CodePrinter::operator<<(this->out,(BlankLine *)&blankLine);
  return;
}

Assistant:

void printStruct (const Structure& s) const
        {
            out << "struct " << s.getName() << newLine;

            int maxTypeLen = 0;

            for (auto& m : s.getMembers())
                maxTypeLen = std::max (maxTypeLen, (int) getTypeDescription (m.type).length());

            {
                auto indent = out.createIndentWithBraces (2);

                for (auto& m : s.getMembers())
                    out << padded (getTypeDescription (m.type), maxTypeLen + 2) << m.name << ';' << newLine;
            }

            out << blankLine;
        }